

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopCheaperProperSubset(WhereLoop *pX,WhereLoop *pY)

{
  ushort uVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((pX->rRun <= pY->rRun) || (iVar5 = 0, pX->nOut <= pY->nOut)) {
    if (((pX->u).btree.nEq < (pY->u).btree.nEq) &&
       ((((pX->u).btree.pIndex == (pY->u).btree.pIndex && (pX->nSkip == 0)) && (pY->nSkip == 0)))) {
      iVar5 = 1;
    }
    else {
      iVar4 = 0;
      iVar5 = iVar4;
      if (pY->nSkip <= pX->nSkip) {
        uVar1 = pX->nLTerm;
        iVar5 = 0;
        if ((int)((uint)uVar1 - (uint)pX->nSkip) < (int)((uint)pY->nLTerm - (uint)pY->nSkip)) {
          if ((ulong)uVar1 != 0) {
            uVar6 = (ulong)uVar1;
            do {
              uVar7 = (ulong)pY->nLTerm;
              if (pX->aLTerm[uVar6 - 1] != (WhereTerm *)0x0) {
                do {
                  if ((long)uVar7 < 1) {
                    return 0;
                  }
                  lVar3 = uVar7 - 1;
                  uVar7 = uVar7 - 1;
                } while (pY->aLTerm[lVar3] != pX->aLTerm[uVar6 - 1]);
              }
              bVar2 = 1 < (long)uVar6;
              uVar6 = uVar6 - 1;
            } while (bVar2);
          }
          if (((pX->wsFlags & 0x40) == 0) || ((pY->wsFlags & 0x40) != 0)) {
            iVar4 = 1;
          }
          return iVar4;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int whereLoopCheaperProperSubset(
  const WhereLoop *pX,       /* First WhereLoop to compare */
  const WhereLoop *pY        /* Compare against this WhereLoop */
){
  int i, j;
  if( pX->rRun>pY->rRun && pX->nOut>pY->nOut ) return 0; /* (1d) and (2a) */
  assert( (pX->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pY->wsFlags & WHERE_VIRTUALTABLE)==0 );
  if( pX->u.btree.nEq < pY->u.btree.nEq                  /* (1b) */
   && pX->u.btree.pIndex==pY->u.btree.pIndex             /* (1a) */
   && pX->nSkip==0 && pY->nSkip==0                       /* (1c) */
  ){
    return 1;  /* Case 1 is true */
  }
  if( pX->nLTerm-pX->nSkip >= pY->nLTerm-pY->nSkip ){
    return 0;                                            /* (2b) */
  }
  if( pY->nSkip > pX->nSkip ) return 0;                  /* (2d) */
  for(i=pX->nLTerm-1; i>=0; i--){
    if( pX->aLTerm[i]==0 ) continue;
    for(j=pY->nLTerm-1; j>=0; j--){
      if( pY->aLTerm[j]==pX->aLTerm[i] ) break;
    }
    if( j<0 ) return 0;                                  /* (2c) */
  }
  if( (pX->wsFlags&WHERE_IDX_ONLY)!=0
   && (pY->wsFlags&WHERE_IDX_ONLY)==0 ){
    return 0;                                            /* (2e) */
  }
  return 1;  /* Case 2 is true */
}